

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O0

size_t ZSTD_compressBlock_doubleFast_extDict_generic
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize,
                 U32 mls)

{
  uint h;
  uint h_00;
  uint uVar1;
  U32 *pUVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  int iVar6;
  U32 UVar7;
  U32 UVar8;
  uint uVar9;
  U32 UVar10;
  U32 UVar11;
  uint uVar12;
  uint uVar13;
  BYTE *iEnd;
  BYTE *pBVar14;
  BYTE *iStart;
  BYTE *pBVar15;
  BYTE *pBVar16;
  size_t sVar17;
  long lVar18;
  U64 UVar19;
  U64 UVar20;
  size_t sVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  ulong uVar24;
  bool bVar25;
  BYTE *local_628;
  BYTE *local_618;
  BYTE *local_588;
  BYTE *local_570;
  BYTE *local_558;
  BYTE *local_518;
  BYTE *local_500;
  BYTE *local_4f0;
  BYTE *local_4e8;
  BYTE *local_4d8;
  uint local_4c8;
  U32 tmpOffset;
  size_t repLength2;
  BYTE *repEnd2;
  BYTE *repMatch2;
  U32 repIndex2;
  U32 current2;
  U32 indexToInsert;
  BYTE *lowMatchPtr_2;
  BYTE *matchEnd_2;
  BYTE *lowMatchPtr_1;
  BYTE *matchEnd_1;
  BYTE *pBStack_470;
  U32 offset_3;
  BYTE *match3;
  BYTE *match3Base;
  U32 matchIndex3;
  size_t h3;
  U32 offset;
  BYTE *lowMatchPtr;
  BYTE *matchEnd;
  BYTE *repMatchEnd;
  size_t mLength;
  BYTE *repMatch;
  BYTE *repBase;
  U32 repIndex;
  U32 curr;
  BYTE *matchLong;
  BYTE *matchLongBase;
  U32 matchLongIndex;
  size_t hLong;
  BYTE *match;
  BYTE *matchBase;
  U32 matchIndex;
  size_t hSmall;
  U32 offset_2;
  U32 offset_1;
  BYTE *dictEnd;
  BYTE *dictStart;
  BYTE *dictBase;
  BYTE *prefixStart;
  U32 prefixStartIndex;
  U32 dictLimit;
  U32 dictStartIndex;
  U32 lowLimit;
  U32 endIndex;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  U32 hBitsS;
  U32 *hashSmall;
  U32 hBitsL;
  U32 *hashLong;
  ZSTD_compressionParameters *cParams;
  U32 mls_local;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  size_t local_2d8;
  size_t local_2c0;
  size_t local_2a8;
  size_t local_230;
  size_t mlBase_3;
  BYTE *litEnd_3;
  BYTE *litLimit_w_3;
  size_t mlBase_2;
  BYTE *litEnd_2;
  BYTE *litLimit_w_2;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_4;
  ptrdiff_t diff_3;
  
  pUVar2 = ms->hashTable;
  h = (ms->cParams).hashLog;
  pUVar3 = ms->chainTable;
  h_00 = (ms->cParams).chainLog;
  iEnd = (BYTE *)((long)src + srcSize);
  pBVar14 = iEnd + -8;
  pBVar4 = (ms->window).base;
  iVar6 = (int)pBVar4;
  UVar7 = ZSTD_getLowestMatchIndex(ms,((int)src - iVar6) + (int)srcSize,(ms->cParams).windowLog);
  uVar12 = (ms->window).dictLimit;
  local_4c8 = UVar7;
  if (UVar7 < uVar12) {
    local_4c8 = uVar12;
  }
  iStart = pBVar4 + local_4c8;
  pBVar5 = (ms->window).dictBase;
  pBVar15 = pBVar5 + UVar7;
  pBVar16 = pBVar5 + local_4c8;
  hSmall._4_4_ = *rep;
  hSmall._0_4_ = rep[1];
  iend = (BYTE *)src;
  anchor = (BYTE *)src;
  if (local_4c8 == UVar7) {
    ms_local = (ZSTD_matchState_t *)ZSTD_compressBlock_doubleFast(ms,seqStore,rep,src,srcSize);
  }
  else {
LAB_0027b7cc:
    uVar12 = hSmall._4_4_;
    if (anchor < pBVar14) {
      if (0x20 < h_00) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      switch(mls) {
      default:
        local_230 = ZSTD_hash4Ptr(anchor,h_00);
        break;
      case 5:
        local_230 = ZSTD_hash5Ptr(anchor,h_00);
        break;
      case 6:
        local_230 = ZSTD_hash6Ptr(anchor,h_00);
        break;
      case 7:
        local_230 = ZSTD_hash7Ptr(anchor,h_00);
        break;
      case 8:
        local_230 = ZSTD_hash8Ptr(anchor,h_00);
      }
      uVar13 = pUVar3[local_230];
      local_4d8 = pBVar4;
      if (uVar13 < local_4c8) {
        local_4d8 = pBVar5;
      }
      hLong = (size_t)(local_4d8 + uVar13);
      if (0x20 < h) {
        __assert_fail("hBits <= 32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
      }
      sVar17 = ZSTD_hash8Ptr(anchor,h);
      uVar1 = pUVar2[sVar17];
      local_4e8 = pBVar4;
      if (uVar1 < local_4c8) {
        local_4e8 = pBVar5;
      }
      _repIndex = local_4e8 + uVar1;
      UVar8 = (int)anchor - iVar6;
      uVar9 = (UVar8 + 1) - hSmall._4_4_;
      local_4f0 = pBVar4;
      if (uVar9 < local_4c8) {
        local_4f0 = pBVar5;
      }
      pUVar2[sVar17] = UVar8;
      pUVar3[local_230] = UVar8;
      if ((local_4c8 - 1) - uVar9 < 3 || (UVar8 + 1) - UVar7 < hSmall._4_4_) {
LAB_0027c1dd:
        if (UVar7 < uVar1) {
          UVar19 = MEM_read64(_repIndex);
          UVar20 = MEM_read64(anchor);
          if (UVar19 != UVar20) goto LAB_0027c96a;
          local_518 = iStart;
          pBVar23 = iEnd;
          if (uVar1 < local_4c8) {
            local_518 = pBVar15;
            pBVar23 = pBVar16;
          }
          sVar17 = ZSTD_count_2segments(anchor + 8,_repIndex + 8,iEnd,pBVar23,iStart);
          repMatchEnd = (BYTE *)(sVar17 + 8);
          hSmall._4_4_ = UVar8 - uVar1;
          while( true ) {
            bVar25 = false;
            if (iend < anchor && local_518 < _repIndex) {
              bVar25 = anchor[-1] == _repIndex[-1];
            }
            if (!bVar25) break;
            anchor = anchor + -1;
            _repIndex = _repIndex + -1;
            repMatchEnd = repMatchEnd + 1;
          }
          uVar24 = (long)anchor - (long)iend;
          if (hSmall._4_4_ == 0) {
            __assert_fail("(offset)>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                          ,0x295,
                          "size_t ZSTD_compressBlock_doubleFast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29d,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x29f,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar24) {
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (iEnd < iend + uVar24) {
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2a1,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (iEnd + -0x20 < iend + uVar24) {
            ZSTD_safecopyLiterals(seqStore->lit,iend,iend + uVar24,iEnd + -0x20);
          }
          else {
            ZSTD_copy16(seqStore->lit,iend);
            if (0x10 < uVar24) {
              pBVar23 = seqStore->lit;
              pBVar22 = pBVar23 + 0x10;
              lVar18 = (long)pBVar22 - (long)(iend + 0x10);
              if ((lVar18 < 0x10) && (-0x10 < lVar18)) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                              ,0xe9,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(pBVar22,iend + 0x10);
              if (0x10 < (long)(uVar24 - 0x10)) {
                oend_1 = pBVar23 + 0x20;
                do {
                  op_1 = iend + 0x20;
                  ZSTD_copy16(oend_1,op_1);
                  ZSTD_copy16(oend_1 + 0x10,iend + 0x30);
                  oend_1 = oend_1 + 0x20;
                  iend = op_1;
                } while (oend_1 < pBVar22 + (uVar24 - 0x10));
              }
            }
          }
          seqStore->lit = seqStore->lit + uVar24;
          if (0xffff < uVar24) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->litLength = (U16)uVar24;
          seqStore->sequences->offBase = hSmall._4_4_ + 3;
          if (repMatchEnd < (BYTE *)0x3) {
            __assert_fail("matchLength >= MINMATCH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,700,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if ((BYTE *)0xffff < repMatchEnd + -3) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2bf,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
          }
          seqStore->sequences->mlBase = (U16)(repMatchEnd + -3);
          seqStore->sequences = seqStore->sequences + 1;
LAB_0027d3eb:
          hSmall._0_4_ = uVar12;
          goto LAB_0027d3ed;
        }
LAB_0027c96a:
        if (UVar7 < uVar13) {
          UVar10 = MEM_read32((void *)hLong);
          UVar11 = MEM_read32(anchor);
          if (UVar10 == UVar11) {
            if (0x20 < h) {
              __assert_fail("hBits <= 32",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
            }
            sVar17 = ZSTD_hash8Ptr(anchor + 1,h);
            uVar1 = pUVar2[sVar17];
            local_558 = pBVar4;
            if (uVar1 < local_4c8) {
              local_558 = pBVar5;
            }
            pBStack_470 = local_558 + uVar1;
            pUVar2[sVar17] = UVar8 + 1;
            if (UVar7 < uVar1) {
              UVar19 = MEM_read64(pBStack_470);
              UVar20 = MEM_read64(anchor + 1);
              if (UVar19 != UVar20) goto LAB_0027cd05;
              local_570 = iStart;
              pBVar23 = iEnd;
              if (uVar1 < local_4c8) {
                local_570 = pBVar15;
                pBVar23 = pBVar16;
              }
              sVar17 = ZSTD_count_2segments(anchor + 9,pBStack_470 + 8,iEnd,pBVar23,iStart);
              repMatchEnd = (BYTE *)(sVar17 + 8);
              anchor = anchor + 1;
              matchEnd_1._4_4_ = (UVar8 + 1) - uVar1;
              while( true ) {
                bVar25 = false;
                if (iend < anchor && local_570 < pBStack_470) {
                  bVar25 = anchor[-1] == pBStack_470[-1];
                }
                if (!bVar25) break;
                anchor = anchor + -1;
                pBStack_470 = pBStack_470 + -1;
                repMatchEnd = repMatchEnd + 1;
              }
            }
            else {
LAB_0027cd05:
              local_588 = iStart;
              pBVar23 = iEnd;
              if (uVar13 < local_4c8) {
                local_588 = pBVar15;
                pBVar23 = pBVar16;
              }
              sVar17 = ZSTD_count_2segments(anchor + 4,(BYTE *)(hLong + 4),iEnd,pBVar23,iStart);
              repMatchEnd = (BYTE *)(sVar17 + 4);
              matchEnd_1._4_4_ = UVar8 - uVar13;
              while( true ) {
                bVar25 = false;
                if (iend < anchor && local_588 < hLong) {
                  bVar25 = anchor[-1] == *(BYTE *)(hLong - 1);
                }
                if (!bVar25) break;
                anchor = anchor + -1;
                hLong = hLong - 1;
                repMatchEnd = repMatchEnd + 1;
              }
            }
            hSmall._4_4_ = matchEnd_1._4_4_;
            uVar24 = (long)anchor - (long)iend;
            if (matchEnd_1._4_4_ == 0) {
              __assert_fail("(offset)>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                            ,0x2ae,
                            "size_t ZSTD_compressBlock_doubleFast_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x29d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x29f,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar24) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (iEnd < iend + uVar24) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2a1,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (iEnd + -0x20 < iend + uVar24) {
              ZSTD_safecopyLiterals(seqStore->lit,iend,iend + uVar24,iEnd + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,iend);
              if (0x10 < uVar24) {
                pBVar23 = seqStore->lit;
                pBVar22 = pBVar23 + 0x10;
                lVar18 = (long)pBVar22 - (long)(iend + 0x10);
                if ((lVar18 < 0x10) && (-0x10 < lVar18)) {
                  __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                                ,0xe9,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
                ZSTD_copy16(pBVar22,iend + 0x10);
                if (0x10 < (long)(uVar24 - 0x10)) {
                  oend_2 = pBVar23 + 0x20;
                  do {
                    op_2 = iend + 0x20;
                    ZSTD_copy16(oend_2,op_2);
                    ZSTD_copy16(oend_2 + 0x10,iend + 0x30);
                    oend_2 = oend_2 + 0x20;
                    iend = op_2;
                  } while (oend_2 < pBVar22 + (uVar24 - 0x10));
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar24;
            if (0xffff < uVar24) {
              if (seqStore->longLengthType != ZSTD_llt_none) {
                __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,0x2b2,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->litLength = (U16)uVar24;
            seqStore->sequences->offBase = matchEnd_1._4_4_ + 3;
            if (repMatchEnd < (BYTE *)0x3) {
              __assert_fail("matchLength >= MINMATCH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,700,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if ((BYTE *)0xffff < repMatchEnd + -3) {
              if (seqStore->longLengthType != ZSTD_llt_none) {
                __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,0x2bf,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->mlBase = (U16)(repMatchEnd + -3);
            seqStore->sequences = seqStore->sequences + 1;
            goto LAB_0027d3eb;
          }
        }
        anchor = anchor + ((long)anchor - (long)iend >> 8) + 1;
      }
      else {
        UVar10 = MEM_read32(local_4f0 + uVar9);
        UVar11 = MEM_read32(anchor + 1);
        if (UVar10 != UVar11) goto LAB_0027c1dd;
        local_500 = iEnd;
        if (uVar9 < local_4c8) {
          local_500 = pBVar16;
        }
        sVar17 = ZSTD_count_2segments(anchor + 5,local_4f0 + uVar9 + 4,iEnd,local_500,iStart);
        repMatchEnd = (BYTE *)(sVar17 + 4);
        anchor = anchor + 1;
        uVar24 = (long)anchor - (long)iend;
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + uVar24) {
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < iend + uVar24) {
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd + -0x20 < iend + uVar24) {
          ZSTD_safecopyLiterals(seqStore->lit,iend,iend + uVar24,iEnd + -0x20);
        }
        else {
          ZSTD_copy16(seqStore->lit,iend);
          if (0x10 < uVar24) {
            pBVar23 = seqStore->lit;
            pBVar22 = pBVar23 + 0x10;
            lVar18 = (long)pBVar22 - (long)(iend + 0x10);
            if ((lVar18 < 0x10) && (-0x10 < lVar18)) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(pBVar22,iend + 0x10);
            if (0x10 < (long)(uVar24 - 0x10)) {
              oend = pBVar23 + 0x20;
              do {
                op = iend + 0x20;
                ZSTD_copy16(oend,op);
                ZSTD_copy16(oend + 0x10,iend + 0x30);
                oend = oend + 0x20;
                iend = op;
              } while (oend < pBVar22 + (uVar24 - 0x10));
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar24;
        if (0xffff < uVar24) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->litLength = (U16)uVar24;
        seqStore->sequences->offBase = 1;
        if (repMatchEnd < (BYTE *)0x3) {
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < sVar17 + 1) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
        }
        seqStore->sequences->mlBase = (U16)(sVar17 + 1);
        seqStore->sequences = seqStore->sequences + 1;
LAB_0027d3ed:
        iend = repMatchEnd + (long)anchor;
        anchor = iend;
        if (iend <= pBVar14) {
          uVar12 = UVar8 + 2;
          if (0x20 < h) {
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          sVar17 = ZSTD_hash8Ptr(pBVar4 + uVar12,h);
          pUVar2[sVar17] = uVar12;
          if (0x20 < h) {
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          sVar17 = ZSTD_hash8Ptr(iend + -2,h);
          pUVar2[sVar17] = ((int)iend + -2) - iVar6;
          pBVar23 = pBVar4 + uVar12;
          if (0x20 < h_00) {
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          switch(mls) {
          default:
            local_2a8 = ZSTD_hash4Ptr(pBVar23,h_00);
            break;
          case 5:
            local_2a8 = ZSTD_hash5Ptr(pBVar23,h_00);
            break;
          case 6:
            local_2a8 = ZSTD_hash6Ptr(pBVar23,h_00);
            break;
          case 7:
            local_2a8 = ZSTD_hash7Ptr(pBVar23,h_00);
            break;
          case 8:
            local_2a8 = ZSTD_hash8Ptr(pBVar23,h_00);
          }
          pUVar3[local_2a8] = uVar12;
          pBVar23 = iend + -1;
          if (0x20 < h_00) {
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
          switch(mls) {
          default:
            local_2c0 = ZSTD_hash4Ptr(pBVar23,h_00);
            break;
          case 5:
            local_2c0 = ZSTD_hash5Ptr(pBVar23,h_00);
            break;
          case 6:
            local_2c0 = ZSTD_hash6Ptr(pBVar23,h_00);
            break;
          case 7:
            local_2c0 = ZSTD_hash7Ptr(pBVar23,h_00);
            break;
          case 8:
            local_2c0 = ZSTD_hash8Ptr(pBVar23,h_00);
          }
          pUVar3[local_2c0] = ((int)iend + -1) - iVar6;
          for (; uVar12 = (U32)hSmall, iend = anchor, anchor <= pBVar14;
              anchor = anchor + sVar17 + 4) {
            UVar8 = (int)anchor - iVar6;
            uVar13 = UVar8 - (U32)hSmall;
            if (uVar13 < local_4c8) {
              local_618 = pBVar5 + uVar13;
            }
            else {
              local_618 = pBVar4 + uVar13;
            }
            if ((local_4c8 - 1) - uVar13 < 3 || UVar8 - UVar7 < (U32)hSmall) break;
            UVar10 = MEM_read32(local_618);
            UVar11 = MEM_read32(anchor);
            if (UVar10 != UVar11) break;
            local_628 = iEnd;
            if (uVar13 < local_4c8) {
              local_628 = pBVar16;
            }
            sVar17 = ZSTD_count_2segments(anchor + 4,local_618 + 4,iEnd,local_628,iStart);
            hSmall._0_4_ = hSmall._4_4_;
            hSmall._4_4_ = uVar12;
            if (seqStore->maxNbSeq <=
                (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
              __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x29d,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0x20000 < seqStore->maxNbLit) {
              __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x29f,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit) {
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2a0,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (iEnd < anchor) {
              __assert_fail("literals + litLength <= litLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2a1,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (iEnd + -0x20 < anchor) {
              ZSTD_safecopyLiterals(seqStore->lit,anchor,anchor,iEnd + -0x20);
            }
            else {
              ZSTD_copy16(seqStore->lit,anchor);
            }
            seqStore->lit = seqStore->lit;
            seqStore->sequences->litLength = 0;
            seqStore->sequences->offBase = 1;
            if (sVar17 + 4 < 3) {
              __assert_fail("matchLength >= MINMATCH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,700,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            if (0xffff < sVar17 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) {
                __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                              ,0x2bf,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
            }
            seqStore->sequences->mlBase = (U16)(sVar17 + 1);
            seqStore->sequences = seqStore->sequences + 1;
            if (0x20 < h_00) {
              __assert_fail("hBits <= 32",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
            }
            switch(mls) {
            default:
              local_2d8 = ZSTD_hash4Ptr(anchor,h_00);
              break;
            case 5:
              local_2d8 = ZSTD_hash5Ptr(anchor,h_00);
              break;
            case 6:
              local_2d8 = ZSTD_hash6Ptr(anchor,h_00);
              break;
            case 7:
              local_2d8 = ZSTD_hash7Ptr(anchor,h_00);
              break;
            case 8:
              local_2d8 = ZSTD_hash8Ptr(anchor,h_00);
            }
            pUVar3[local_2d8] = UVar8;
            if (0x20 < h) {
              __assert_fail("hBits <= 32",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
            }
            sVar21 = ZSTD_hash8Ptr(anchor,h);
            pUVar2[sVar21] = UVar8;
          }
        }
      }
      goto LAB_0027b7cc;
    }
    *rep = hSmall._4_4_;
    rep[1] = (U32)hSmall;
    ms_local = (ZSTD_matchState_t *)(iEnd + -(long)iend);
  }
  return (size_t)ms_local;
}

Assistant:

static size_t ZSTD_compressBlock_doubleFast_extDict_generic(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize,
        U32 const mls /* template */)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32* const hashLong = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const istart = (const BYTE*)src;
    const BYTE* ip = istart;
    const BYTE* anchor = istart;
    const BYTE* const iend = istart + srcSize;
    const BYTE* const ilimit = iend - 8;
    const BYTE* const base = ms->window.base;
    const U32   endIndex = (U32)((size_t)(istart - base) + srcSize);
    const U32   lowLimit = ZSTD_getLowestMatchIndex(ms, endIndex, cParams->windowLog);
    const U32   dictStartIndex = lowLimit;
    const U32   dictLimit = ms->window.dictLimit;
    const U32   prefixStartIndex = (dictLimit > lowLimit) ? dictLimit : lowLimit;
    const BYTE* const prefixStart = base + prefixStartIndex;
    const BYTE* const dictBase = ms->window.dictBase;
    const BYTE* const dictStart = dictBase + dictStartIndex;
    const BYTE* const dictEnd = dictBase + prefixStartIndex;
    U32 offset_1=rep[0], offset_2=rep[1];

    DEBUGLOG(5, "ZSTD_compressBlock_doubleFast_extDict_generic (srcSize=%zu)", srcSize);

    /* if extDict is invalidated due to maxDistance, switch to "regular" variant */
    if (prefixStartIndex == dictStartIndex)
        return ZSTD_compressBlock_doubleFast(ms, seqStore, rep, src, srcSize);

    /* Search Loop */
    while (ip < ilimit) {  /* < instead of <=, because (ip+1) */
        const size_t hSmall = ZSTD_hashPtr(ip, hBitsS, mls);
        const U32 matchIndex = hashSmall[hSmall];
        const BYTE* const matchBase = matchIndex < prefixStartIndex ? dictBase : base;
        const BYTE* match = matchBase + matchIndex;

        const size_t hLong = ZSTD_hashPtr(ip, hBitsL, 8);
        const U32 matchLongIndex = hashLong[hLong];
        const BYTE* const matchLongBase = matchLongIndex < prefixStartIndex ? dictBase : base;
        const BYTE* matchLong = matchLongBase + matchLongIndex;

        const U32 curr = (U32)(ip-base);
        const U32 repIndex = curr + 1 - offset_1;   /* offset_1 expected <= curr +1 */
        const BYTE* const repBase = repIndex < prefixStartIndex ? dictBase : base;
        const BYTE* const repMatch = repBase + repIndex;
        size_t mLength;
        hashSmall[hSmall] = hashLong[hLong] = curr;   /* update hash table */

        if ((((U32)((prefixStartIndex-1) - repIndex) >= 3) /* intentional underflow : ensure repIndex doesn't overlap dict + prefix */
            & (offset_1 <= curr+1 - dictStartIndex)) /* note: we are searching at curr+1 */
          && (MEM_read32(repMatch) == MEM_read32(ip+1)) ) {
            const BYTE* repMatchEnd = repIndex < prefixStartIndex ? dictEnd : iend;
            mLength = ZSTD_count_2segments(ip+1+4, repMatch+4, iend, repMatchEnd, prefixStart) + 4;
            ip++;
            ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, REPCODE1_TO_OFFBASE, mLength);
        } else {
            if ((matchLongIndex > dictStartIndex) && (MEM_read64(matchLong) == MEM_read64(ip))) {
                const BYTE* const matchEnd = matchLongIndex < prefixStartIndex ? dictEnd : iend;
                const BYTE* const lowMatchPtr = matchLongIndex < prefixStartIndex ? dictStart : prefixStart;
                U32 offset;
                mLength = ZSTD_count_2segments(ip+8, matchLong+8, iend, matchEnd, prefixStart) + 8;
                offset = curr - matchLongIndex;
                while (((ip>anchor) & (matchLong>lowMatchPtr)) && (ip[-1] == matchLong[-1])) { ip--; matchLong--; mLength++; }   /* catch up */
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, OFFSET_TO_OFFBASE(offset), mLength);

            } else if ((matchIndex > dictStartIndex) && (MEM_read32(match) == MEM_read32(ip))) {
                size_t const h3 = ZSTD_hashPtr(ip+1, hBitsL, 8);
                U32 const matchIndex3 = hashLong[h3];
                const BYTE* const match3Base = matchIndex3 < prefixStartIndex ? dictBase : base;
                const BYTE* match3 = match3Base + matchIndex3;
                U32 offset;
                hashLong[h3] = curr + 1;
                if ( (matchIndex3 > dictStartIndex) && (MEM_read64(match3) == MEM_read64(ip+1)) ) {
                    const BYTE* const matchEnd = matchIndex3 < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex3 < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+9, match3+8, iend, matchEnd, prefixStart) + 8;
                    ip++;
                    offset = curr+1 - matchIndex3;
                    while (((ip>anchor) & (match3>lowMatchPtr)) && (ip[-1] == match3[-1])) { ip--; match3--; mLength++; } /* catch up */
                } else {
                    const BYTE* const matchEnd = matchIndex < prefixStartIndex ? dictEnd : iend;
                    const BYTE* const lowMatchPtr = matchIndex < prefixStartIndex ? dictStart : prefixStart;
                    mLength = ZSTD_count_2segments(ip+4, match+4, iend, matchEnd, prefixStart) + 4;
                    offset = curr - matchIndex;
                    while (((ip>anchor) & (match>lowMatchPtr)) && (ip[-1] == match[-1])) { ip--; match--; mLength++; }   /* catch up */
                }
                offset_2 = offset_1;
                offset_1 = offset;
                ZSTD_storeSeq(seqStore, (size_t)(ip-anchor), anchor, iend, OFFSET_TO_OFFBASE(offset), mLength);

            } else {
                ip += ((ip-anchor) >> kSearchStrength) + 1;
                continue;
        }   }

        /* move to next sequence start */
        ip += mLength;
        anchor = ip;

        if (ip <= ilimit) {
            /* Complementary insertion */
            /* done after iLimit test, as candidates could be > iend-8 */
            {   U32 const indexToInsert = curr+2;
                hashLong[ZSTD_hashPtr(base+indexToInsert, hBitsL, 8)] = indexToInsert;
                hashLong[ZSTD_hashPtr(ip-2, hBitsL, 8)] = (U32)(ip-2-base);
                hashSmall[ZSTD_hashPtr(base+indexToInsert, hBitsS, mls)] = indexToInsert;
                hashSmall[ZSTD_hashPtr(ip-1, hBitsS, mls)] = (U32)(ip-1-base);
            }

            /* check immediate repcode */
            while (ip <= ilimit) {
                U32 const current2 = (U32)(ip-base);
                U32 const repIndex2 = current2 - offset_2;
                const BYTE* repMatch2 = repIndex2 < prefixStartIndex ? dictBase + repIndex2 : base + repIndex2;
                if ( (((U32)((prefixStartIndex-1) - repIndex2) >= 3)   /* intentional overflow : ensure repIndex2 doesn't overlap dict + prefix */
                    & (offset_2 <= current2 - dictStartIndex))
                  && (MEM_read32(repMatch2) == MEM_read32(ip)) ) {
                    const BYTE* const repEnd2 = repIndex2 < prefixStartIndex ? dictEnd : iend;
                    size_t const repLength2 = ZSTD_count_2segments(ip+4, repMatch2+4, iend, repEnd2, prefixStart) + 4;
                    U32 const tmpOffset = offset_2; offset_2 = offset_1; offset_1 = tmpOffset;   /* swap offset_2 <=> offset_1 */
                    ZSTD_storeSeq(seqStore, 0, anchor, iend, REPCODE1_TO_OFFBASE, repLength2);
                    hashSmall[ZSTD_hashPtr(ip, hBitsS, mls)] = current2;
                    hashLong[ZSTD_hashPtr(ip, hBitsL, 8)] = current2;
                    ip += repLength2;
                    anchor = ip;
                    continue;
                }
                break;
    }   }   }

    /* save reps for next block */
    rep[0] = offset_1;
    rep[1] = offset_2;

    /* Return the last literals size */
    return (size_t)(iend - anchor);
}